

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O0

void __thiscall
TCLAP::ValueArg<unsigned_long>::ValueArg
          (ValueArg<unsigned_long> *this,string *flag,string *name,string *desc,bool req,
          unsigned_long val,string *typeDesc,CmdLineInterface *parser,Visitor *v)

{
  undefined8 *in_RDI;
  undefined8 in_R9;
  string *in_stack_00000008;
  long *in_stack_00000010;
  bool in_stack_000003d6;
  bool in_stack_000003d7;
  string *in_stack_000003d8;
  string *in_stack_000003e0;
  string *in_stack_000003e8;
  Arg *in_stack_000003f0;
  Visitor *in_stack_00000400;
  
  Arg::Arg(in_stack_000003f0,in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,in_stack_000003d7
           ,in_stack_000003d6,in_stack_00000400);
  *in_RDI = &PTR__ValueArg_002064c0;
  in_RDI[0x15] = in_R9;
  in_RDI[0x16] = in_R9;
  std::__cxx11::string::string((string *)(in_RDI + 0x17),in_stack_00000008);
  in_RDI[0x1b] = 0;
  (**(code **)(*in_stack_00000010 + 0x18))();
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      CmdLineInterface& parser,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ 
    parser.add( this );
}